

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::ArrayBuilder<capnp::schema::Node::Reader>::dispose
          (ArrayBuilder<capnp::schema::Node::Reader> *this)

{
  Reader *pRVar1;
  RemoveConst<capnp::schema::Node::Reader> *pRVar2;
  Reader *pRVar3;
  
  pRVar1 = this->ptr;
  if (pRVar1 != (Reader *)0x0) {
    pRVar2 = this->pos;
    pRVar3 = this->endPtr;
    this->ptr = (Reader *)0x0;
    this->pos = (RemoveConst<capnp::schema::Node::Reader> *)0x0;
    this->endPtr = (Reader *)0x0;
    (*(code *)**(undefined8 **)this->disposer)
              (this->disposer,pRVar1,0x30,((long)pRVar2 - (long)pRVar1) / 0x30,
               ((long)pRVar3 - (long)pRVar1) / 0x30,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }